

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall cmCacheManager::RemoveCacheEntry(cmCacheManager *this,string *key)

{
  iterator __position;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
               ::find(&(this->Cache)._M_t,key);
  if ((_Rb_tree_header *)__position._M_node != &(this->Cache)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCacheManager::CacheEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCacheManager::CacheEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCacheManager::CacheEntry>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCacheManager::CacheEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCacheManager::CacheEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCacheManager::CacheEntry>>>
                        *)&this->Cache,__position);
    return;
  }
  return;
}

Assistant:

void cmCacheManager::RemoveCacheEntry(const std::string& key)
{
  CacheEntryMap::iterator i = this->Cache.find(key);
  if (i != this->Cache.end()) {
    this->Cache.erase(i);
  }
}